

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O3

Action<int_(const_int_*,_unsigned_int,_void_*,_unsigned_long_*,_const_void_*,_unsigned_long)> *
__thiscall
testing::internal::DoAllAction::operator_cast_to_Action
          (Action<int_(const_int_*,_unsigned_int,_void_*,_unsigned_long_*,_const_void_*,_unsigned_long)>
           *__return_storage_ptr__,DoAllAction *this)

{
  Action<int_(const_int_*,_unsigned_int,_void_*,_unsigned_long_*,_const_void_*,_unsigned_long)>
  *this_00;
  undefined4 uVar1;
  ActionInterface<int_(const_int_*,_unsigned_int,_void_*,_unsigned_long_*,_const_void_*,_unsigned_long)>
  *impl;
  Op local_50;
  
  DoAllAction<testing::PolymorphicAction<testing::internal::AssignAction<int,int>>,testing::internal::ReturnAction<int>>
  ::
  Convert<testing::Action<void(int_const*,unsigned_int,void*,unsigned_long*,void_const*,unsigned_long)>,0ul>
            (&local_50);
  impl = (ActionInterface<int_(const_int_*,_unsigned_int,_void_*,_unsigned_long_*,_const_void_*,_unsigned_long)>
          *)operator_new(0x10);
  this_00 = &local_50.last;
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_001e8370;
  uVar1 = **(undefined4 **)this;
  *(undefined4 *)&impl[1]._vptr_ActionInterface = uVar1;
  *(undefined4 *)((long)&impl[1]._vptr_ActionInterface + 4) = uVar1;
  Action<int_(const_int_*,_unsigned_int,_void_*,_unsigned_long_*,_const_void_*,_unsigned_long)>::
  Action(this_00,impl);
  Action::Action(testing::internal::DoAllAction::operator_cast_to_Action
            ((DoAllAction *)__return_storage_ptr__,&local_50);
  if (local_50.last.fun_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.last.fun_.super__Function_base._M_manager)
              ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
  }
  std::
  vector<testing::Action<void_(const_int_*,_unsigned_int,_void_*,_unsigned_long_*,_const_void_*,_unsigned_long)>,_std::allocator<testing::Action<void_(const_int_*,_unsigned_int,_void_*,_unsigned_long_*,_const_void_*,_unsigned_long)>_>_>
  ::~vector(&local_50.converted);
  return __return_storage_ptr__;
}

Assistant:

operator Action<R(Args...)>() const {  // NOLINT
    struct Op {
      std::vector<Action<void(NonFinalType<Args>...)>> converted;
      Action<R(Args...)> last;
      R operator()(Args... args) const {
        auto tuple_args = std::forward_as_tuple(std::forward<Args>(args)...);
        for (auto& a : converted) {
          a.Perform(tuple_args);
        }
        return last.Perform(std::move(tuple_args));
      }
    };
    return Op{Convert<Action<void(NonFinalType<Args>...)>>(
                  MakeIndexSequence<sizeof...(Actions) - 1>()),
              std::get<sizeof...(Actions) - 1>(actions)};
  }